

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
* wallet::GetAddressBalances
            (map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
             *__return_storage_ptr__,CWallet *wallet)

{
  _Rb_tree_header *p_Var1;
  CWalletTx *wtx;
  long lVar2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  int iVar5;
  isminetype iVar6;
  mapped_type *pmVar7;
  CTxOut *txout;
  CAmount CVar8;
  ulong uVar9;
  __node_base *p_Var10;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  _Hash_node_base *local_e8;
  _Hash_node_base *p_Stack_e0;
  _Hash_node_base *local_d8;
  _Hash_node_base *p_Stack_d0;
  uint32_t local_c8;
  CTxDestination addr;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock7,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/receive.cpp"
             ,0x147,false);
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var10 = &(wallet->mapWallet)._M_h._M_before_begin;
  trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       trusted_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    do {
      do {
        do {
          p_Var10 = p_Var10->_M_nxt;
          if (p_Var10 == (__node_base *)0x0) {
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&trusted_parents._M_t);
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              return __return_storage_ptr__;
            }
            __stack_chk_fail();
          }
          wtx = (CWalletTx *)(p_Var10 + 5);
          bVar4 = CachedTxIsTrusted(wallet,wtx,&trusted_parents);
        } while (!bVar4);
        bVar4 = CWallet::IsTxImmatureCoinBase(wallet,wtx);
      } while (bVar4);
      iVar5 = CWallet::GetTxDepthInMainChain(wallet,wtx);
      addr.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._0_4_ = 3;
      bVar4 = CachedTxIsFromMe(wallet,wtx,(isminefilter *)&addr);
    } while (iVar5 < (int)(uint)!bVar4);
    uVar9 = 0;
    while( true ) {
      p_Var3 = p_Var10[0x38]._M_nxt[3]._M_nxt;
      if ((ulong)(((long)p_Var10[0x38]._M_nxt[4]._M_nxt - (long)p_Var3) / 0x28) <= uVar9) break;
      txout = (CTxOut *)(p_Var3 + uVar9 * 5);
      addr.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._16_8_ = 0;
      addr.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._24_8_ = 0;
      addr.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._0_8_ = 0;
      addr.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._8_8_ = 0;
      addr.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_index = '\0';
      iVar6 = CWallet::IsMine(wallet,txout);
      if (iVar6 != ISMINE_NO) {
        bVar4 = ExtractDestination(&txout->scriptPubKey,&addr);
        if (bVar4) {
          local_e8 = p_Var10[1]._M_nxt;
          p_Stack_e0 = *(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor;
          local_d8 = p_Var10[3]._M_nxt;
          p_Stack_d0 = p_Var10[4]._M_nxt;
          local_c8 = (uint32_t)uVar9;
          bVar4 = CWallet::IsSpent(wallet,(COutPoint *)&local_e8);
          CVar8 = txout->nValue;
          pmVar7 = std::
                   map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
                   ::operator[](__return_storage_ptr__,&addr);
          if (bVar4) {
            CVar8 = 0;
          }
          *pmVar7 = *pmVar7 + CVar8;
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&addr);
      uVar9 = (ulong)((uint32_t)uVar9 + 1);
    }
  } while( true );
}

Assistant:

std::map<CTxDestination, CAmount> GetAddressBalances(const CWallet& wallet)
{
    std::map<CTxDestination, CAmount> balances;

    {
        LOCK(wallet.cs_wallet);
        std::set<uint256> trusted_parents;
        for (const auto& walletEntry : wallet.mapWallet)
        {
            const CWalletTx& wtx = walletEntry.second;

            if (!CachedTxIsTrusted(wallet, wtx, trusted_parents))
                continue;

            if (wallet.IsTxImmatureCoinBase(wtx))
                continue;

            int nDepth = wallet.GetTxDepthInMainChain(wtx);
            if (nDepth < (CachedTxIsFromMe(wallet, wtx, ISMINE_ALL) ? 0 : 1))
                continue;

            for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
                const auto& output = wtx.tx->vout[i];
                CTxDestination addr;
                if (!wallet.IsMine(output))
                    continue;
                if(!ExtractDestination(output.scriptPubKey, addr))
                    continue;

                CAmount n = wallet.IsSpent(COutPoint(Txid::FromUint256(walletEntry.first), i)) ? 0 : output.nValue;
                balances[addr] += n;
            }
        }
    }

    return balances;
}